

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::updateEditorData(QAbstractItemView *this)

{
  long lVar1;
  long in_FS_OFFSET;
  QAbstractItemViewPrivate *d;
  QModelIndex *in_stack_ffffffffffffffd8;
  QModelIndex *in_stack_ffffffffffffffe0;
  QAbstractItemViewPrivate *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QAbstractItemView *)0x80a385);
  QModelIndex::QModelIndex((QModelIndex *)0x80a3a3);
  QModelIndex::QModelIndex((QModelIndex *)0x80a3b2);
  QAbstractItemViewPrivate::updateEditorData
            (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::updateEditorData()
{
    Q_D(QAbstractItemView);
    d->updateEditorData(QModelIndex(), QModelIndex());
}